

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

int ParseFile_CdnBuild(TCascStorage *hs,void *pvListFile)

{
  bool bVar1;
  int iVar2;
  LPBYTE pBVar3;
  size_t sVar4;
  char *szLineEnd;
  char *szLineBegin;
  char *local_80;
  char *local_78;
  int local_6c;
  CASC_CKEY_ENTRY *local_68;
  CASC_CKEY_ENTRY *local_60;
  CASC_ARRAY *local_58;
  CASC_CKEY_ENTRY *local_50;
  CASC_CKEY_ENTRY *local_48;
  CASC_CKEY_ENTRY *local_40;
  CASC_CKEY_ENTRY *local_38;
  
  local_80 = (char *)0x0;
  ConvertIntegerToBytes_4(0xffffffff,(hs->EncodingFile).ContentSize);
  pBVar3 = (LPBYTE)malloc(0x200);
  (hs->VfsRootList).m_pItemArray = pBVar3;
  if (pBVar3 == (LPBYTE)0x0) {
    iVar2 = 0xc;
  }
  else {
    (hs->VfsRootList).m_ItemCountMax = 0x10;
    (hs->VfsRootList).m_ItemCount = 0;
    (hs->VfsRootList).m_ItemSize = 0x20;
    local_6c = 0;
    sVar4 = ListFile_GetNextLine(pvListFile,&local_78,&local_80);
    if (sVar4 != 0) {
      local_60 = &hs->EncodingFile;
      local_58 = &hs->VfsRootList;
      local_38 = &hs->RootFile;
      local_40 = &hs->InstallFile;
      local_48 = &hs->DownloadFile;
      local_50 = &hs->PatchFile;
      local_68 = &hs->VfsRoot;
      do {
        bVar1 = CheckConfigFileVariable
                          (hs,local_78,local_80,"build-product",LoadBuildProduct,(void *)0x0);
        if ((((((!bVar1) &&
               (bVar1 = CheckConfigFileVariable
                                  (hs,local_78,local_80,"build-name",LoadBuildName,(void *)0x0),
               !bVar1)) &&
              (bVar1 = CheckConfigFileVariable(hs,local_78,local_80,"root",LoadCkeyEkey,local_38),
              !bVar1)) &&
             ((bVar1 = CheckConfigFileVariable(hs,local_78,local_80,"install",LoadCkeyEkey,local_40)
              , !bVar1 &&
              (bVar1 = CheckConfigFileVariable
                                 (hs,local_78,local_80,"download",LoadCkeyEkey,local_48), !bVar1))))
            && ((bVar1 = CheckConfigFileVariable
                                   (hs,local_78,local_80,"encoding",LoadCkeyEkey,local_60), !bVar1
                && ((bVar1 = CheckConfigFileVariable
                                       (hs,local_78,local_80,"encoding-size",LoadCkeyEkeySize,
                                        local_60), !bVar1 &&
                    (bVar1 = CheckConfigFileVariable
                                       (hs,local_78,local_80,"patch",LoadCkeyEkey,local_50), !bVar1)
                    ))))) &&
           ((bVar1 = CheckConfigFileVariable(hs,local_78,local_80,"vfs-root",LoadCkeyEkey,local_68),
            !bVar1 && (bVar1 = CheckConfigFileVariable
                                         (hs,local_78,local_80,"vfs-root-size",LoadCkeyEkeySize,
                                          local_68), !bVar1)))) {
          CheckConfigFileVariable(hs,local_78,local_80,"vfs-*",LoadVfsRootEntry,local_58);
        }
        sVar4 = ListFile_GetNextLine(pvListFile,&local_78,&local_80);
      } while (sVar4 != 0);
    }
    bVar1 = IsValidMD5((hs->EncodingFile).CKey);
    iVar2 = 1000;
    if (bVar1) {
      bVar1 = IsValidMD5((hs->EncodingFile).EKey);
      iVar2 = 1000;
      if (bVar1) {
        iVar2 = local_6c;
      }
    }
  }
  return iVar2;
}

Assistant:

static int ParseFile_CdnBuild(TCascStorage * hs, void * pvListFile)
{
    const char * szLineBegin;
    const char * szLineEnd = NULL;
    int nError;

    // Initialize the size of the internal files
    ConvertIntegerToBytes_4(CASC_INVALID_SIZE, hs->EncodingFile.ContentSize);

    // Initialize the empty VFS array
    nError = hs->VfsRootList.Create<QUERY_KEY_PAIR>(0x10);
    if (nError != ERROR_SUCCESS)
        return nError;

    // Parse all variables
    while(ListFile_GetNextLine(pvListFile, &szLineBegin, &szLineEnd) != 0)
    {
        // Product name and build name
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "build-product", LoadBuildProduct, NULL))
            continue;
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "build-name", LoadBuildName, NULL))
            continue;

        // Content key of the ROOT file. Look this up in ENCODING to get the encoded key
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "root", LoadCkeyEkey, &hs->RootFile))
            continue;

        // Content key [+ encoded key] of the INSTALL file
        // If CKey is absent, you need to query the ENCODING file for it
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "install", LoadCkeyEkey, &hs->InstallFile))
            continue;

        // Content key [+ encoded key] of the DOWNLOAD file
        // If CKey is absent, you need to query the ENCODING file for it
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "download", LoadCkeyEkey, &hs->DownloadFile))
            continue;

        // Content key + encoded key of the ENCODING file. Contains CKey+EKey
        // If either none or 1 is found, the game (at least Wow) switches to plain-data(?). Seen in build 20173 
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "encoding", LoadCkeyEkey, &hs->EncodingFile))
            continue;

        // Content and encoded size of the ENCODING file. This helps us to determine size
        // of the ENCODING file better, as the size in the EKEY entries is almost always wrong on WoW storages
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "encoding-size", LoadCkeyEkeySize, &hs->EncodingFile))
            continue;

        // PATCH file
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "patch", LoadCkeyEkey, &hs->PatchFile))
            continue;

        // Load the CKey+EKey of a VFS root file (the root file of the storage VFS)
        if (CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "vfs-root", LoadCkeyEkey, &hs->VfsRoot))
            continue;

        // Load the content size of the VFS root
        if (CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "vfs-root-size", LoadCkeyEkeySize, &hs->VfsRoot))
            continue;

        // Load a directory entry to the VFS
        if(CheckConfigFileVariable(hs, szLineBegin, szLineEnd, "vfs-*", LoadVfsRootEntry, &hs->VfsRootList))
            continue;
    }

    // Both CKey and EKey of ENCODING file is required
    if(!IsValidMD5(hs->EncodingFile.CKey) || !IsValidMD5(hs->EncodingFile.EKey))
        return ERROR_BAD_FORMAT;
    return nError;
}